

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderTag.cpp
# Opt level: O0

int __thiscall
HeaderTag::verify(HeaderTag *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  bool bVar1;
  StreamObjectVector *this_00;
  size_type sVar2;
  ostream *this_01;
  HeaderTag *this_local;
  
  this_00 = Tag::elements(&this->super_Tag);
  sVar2 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::size(this_00);
  bVar1 = sVar2 < 3;
  if (!bVar1) {
    this_01 = std::operator<<((ostream *)&std::cerr,"Error: (HeaderTag): too many entries!");
    sVar2 = std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return (int)CONCAT71((int7)(sVar2 >> 8),bVar1);
}

Assistant:

bool HeaderTag::verify()
{
	if (elements().size() > 2)
	{
		std::cerr << "Error: (HeaderTag): too many entries!" << std::endl;
		return false;
	}

	return true;
}